

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O2

void __thiscall OpenMD::Velocitizer::scale(Velocitizer *this,RealType lambda)

{
  Molecule *pMVar1;
  pointer ppSVar2;
  StuntDouble *this_00;
  MoleculeIterator mi;
  Vector3d j;
  Vector3d v;
  MoleculeIterator local_80;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_80._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_48);
  Vector<double,_3U>::Vector(&local_60);
  pMVar1 = SimInfo::beginMolecule(this->info_,&local_80);
  while (pMVar1 != (Molecule *)0x0) {
    ppSVar2 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar2 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021af0c;
    this_00 = (StuntDouble *)0x0;
    while (this_00 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_78,this_00);
      Vector<double,_3U>::operator=(&local_48,&local_78);
      Vector<double,_3U>::mul(&local_48,lambda);
      StuntDouble::setVel(this_00,(Vector3d *)&local_48);
      if (this_00->objType_ - otDAtom < 2) {
        StuntDouble::getJ((Vector3d *)&local_78,this_00);
        Vector<double,_3U>::operator=(&local_60,&local_78);
        Vector<double,_3U>::mul(&local_60,lambda);
        StuntDouble::setJ(this_00,(Vector3d *)&local_60);
      }
      ppSVar2 = ppSVar2 + 1;
      this_00 = (StuntDouble *)0x0;
      if (ppSVar2 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021af0c:
        this_00 = *ppSVar2;
      }
    }
    pMVar1 = SimInfo::nextMolecule(this->info_,&local_80);
  }
  removeComDrift(this);
  if ((this->globals_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\0') {
    removeAngularDrift(this);
  }
  return;
}

Assistant:

void Velocitizer::scale(RealType lambda) {
    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d v, j;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        v = sd->getVel();
        v *= lambda;
        sd->setVel(v);

        if (sd->isDirectional()) {
          j = sd->getJ();
          j *= lambda;
          sd->setJ(j);
        }
      }
    }

    removeComDrift();

    // Remove angular drift if we are not using periodic boundary
    // conditions:

    if (!globals_->getUsePeriodicBoundaryConditions()) removeAngularDrift();
  }